

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTAudioEngine_GetGlobalVariable(FACTAudioEngine *pEngine,uint16_t nIndex,float *pnValue)

{
  undefined2 in_register_00000032;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  *pnValue = pEngine->globalVariableValues[CONCAT22(in_register_00000032,nIndex)];
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_GetGlobalVariable(
	FACTAudioEngine *pEngine,
	uint16_t nIndex,
	float *pnValue
) {
	FACTVariable *var;

	FAudio_PlatformLockMutex(pEngine->apiLock);

	var = &pEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(!(var->accessibility & 0x04));
	*pnValue = pEngine->globalVariableValues[nIndex];

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}